

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::GeneratedCodeInfo::InternalSwap(GeneratedCodeInfo *this,GeneratedCodeInfo *other)

{
  uint32 uVar1;
  int iVar2;
  void *pvVar3;
  Rep *pRVar4;
  UnknownFieldSet *other_00;
  
  pvVar3 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar3 & 1) == 0) goto LAB_002fdd31;
LAB_002fdd24:
    other_00 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar3 & 1) != 0) goto LAB_002fdd24;
    other_00 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00);
LAB_002fdd31:
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  pRVar4 = (this->annotation_).super_RepeatedPtrFieldBase.rep_;
  (this->annotation_).super_RepeatedPtrFieldBase.rep_ =
       (other->annotation_).super_RepeatedPtrFieldBase.rep_;
  (other->annotation_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  iVar2 = (this->annotation_).super_RepeatedPtrFieldBase.current_size_;
  (this->annotation_).super_RepeatedPtrFieldBase.current_size_ =
       (other->annotation_).super_RepeatedPtrFieldBase.current_size_;
  (other->annotation_).super_RepeatedPtrFieldBase.current_size_ = iVar2;
  iVar2 = (this->annotation_).super_RepeatedPtrFieldBase.total_size_;
  (this->annotation_).super_RepeatedPtrFieldBase.total_size_ =
       (other->annotation_).super_RepeatedPtrFieldBase.total_size_;
  (other->annotation_).super_RepeatedPtrFieldBase.total_size_ = iVar2;
  return;
}

Assistant:

void GeneratedCodeInfo::InternalSwap(GeneratedCodeInfo* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  annotation_.InternalSwap(&other->annotation_);
}